

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

const_iterator __thiscall QJsonObject::constFindImpl<QStringView>(QJsonObject *this,QStringView key)

{
  long lVar1;
  bool bVar2;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_RSI;
  bool *in_RDI;
  long in_FS_OFFSET;
  QJsonValueConstRef QVar3;
  QStringView in_stack_00000020;
  qsizetype index;
  bool keyExists;
  QJsonObject *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::QExplicitlySharedDataPointer::operator_cast_to_bool
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x494fc9);
  if (bVar2) {
    indexOf<QStringView>(in_RSI,in_stack_00000020,in_RDI);
  }
  QVar3 = (QJsonValueConstRef)end(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (const_iterator)QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::const_iterator QJsonObject::constFindImpl(T key) const
{
    bool keyExists = false;
    auto index = o ? indexOf(o, key, &keyExists) : 0;
    if (!keyExists)
        return end();
    return {this, index / 2};
}